

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CascRootFile_WoW6.cpp
# Opt level: O2

int RootHandler_CreateWoW6(TCascStorage *hs,LPBYTE pbRootFile,DWORD cbRootFile,DWORD dwLocaleMask)

{
  int iVar1;
  TRootHandler *this;
  LPBYTE pbRootEnd;
  
  iVar1 = 1000;
  if (0xc < cbRootFile) {
    pbRootEnd = pbRootFile + cbRootFile;
    this = (TRootHandler *)0x0;
    if ((pbRootEnd <= pbRootFile + (ulong)*(uint *)pbRootFile * 4 + 0xc) ||
       (pbRootEnd <= pbRootFile + (ulong)*(uint *)pbRootFile * 0x1c + 0xc)) goto LAB_0011a22c;
    this = (TRootHandler *)operator_new(0x78);
    TRootHandler_WoW6::TRootHandler_WoW6((TRootHandler_WoW6 *)this);
    iVar1 = TRootHandler_WoW6::Load((TRootHandler_WoW6 *)this,pbRootFile,pbRootEnd,dwLocaleMask);
    if (iVar1 == 0) {
      iVar1 = 0;
      goto LAB_0011a22c;
    }
    (*(((TFileTreeRoot *)&this->_vptr_TRootHandler)->super_TRootHandler)._vptr_TRootHandler[1])
              (this);
  }
  this = (TRootHandler *)0x0;
LAB_0011a22c:
  hs->pRootHandler = this;
  return iVar1;
}

Assistant:

int RootHandler_CreateWoW6(TCascStorage * hs, LPBYTE pbRootFile, DWORD cbRootFile, DWORD dwLocaleMask)
{
    TRootHandler_WoW6 * pRootHandler = NULL;
    FILE_LOCALE_BLOCK LocaleBlock;
    int nError = ERROR_BAD_FORMAT;

    // Verify whether this is really a WoW block
    if(TRootHandler_WoW6::CaptureLocaleBlock(LocaleBlock, pbRootFile, pbRootFile + cbRootFile))
    {
        pRootHandler = new TRootHandler_WoW6();
        if(pRootHandler != NULL)
        {
            // Load the root directory. If load failed, we free the object
            nError = pRootHandler->Load(pbRootFile, pbRootFile + cbRootFile, dwLocaleMask);
            if(nError != ERROR_SUCCESS)
            {
                delete pRootHandler;
                pRootHandler = NULL;
            }
        }
    }

    // Assign the root directory (or NULL) and return error
    hs->pRootHandler = pRootHandler;
    return nError;
}